

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.cpp
# Opt level: O2

void __thiscall Corrade::Utility::Debug::resetColorInternal(Debug *this)

{
  byte bVar1;
  Color CVar2;
  long lVar3;
  undefined1 uVar4;
  Error *pEVar5;
  Error local_38;
  
  pEVar5 = &local_38;
  if (this->_output == (ostream *)0x0) {
    return;
  }
  bVar1 = (this->_internalFlags)._value;
  if ((bVar1 & 4) == 0) {
    return;
  }
  (this->_internalFlags)._value = bVar1 & 0xf9 | 2;
  if ((bVar1 & 8) == 0) {
    uVar4 = 0x37;
    if ((bVar1 & 0x10) == 0) {
      if (this->_previousColor == Default) {
        pEVar5 = (Error *)"\x1b[0m";
      }
      else {
        local_38.super_Debug._output._0_4_ = 0x3b305b1b;
        local_38.super_Debug._output._4_1_ = 0x33;
        local_38.super_Debug._output._5_3_ = CONCAT21(0x6d,this->_previousColor + 0x30);
        pEVar5 = &local_38;
      }
      goto LAB_001475a9;
    }
  }
  else {
    uVar4 = 0x31;
    if ((bVar1 & 0x10) != 0) {
      Error::Error(&local_38,(ostream *)&std::cerr,(Flags)0x0);
      operator<<(&local_38.super_Debug,
                 "Assertion !(_internalFlags >= InternalFlag::PreviousColorBold) || !(_internalFlags >= InternalFlag::PreviousColorInverted) failed at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/Utility/Debug.cpp:412"
                );
      Error::~Error(&local_38);
      abort();
    }
  }
  local_38.super_Debug._output._0_4_ = 0x3b305b1b;
  local_38.super_Debug._output._5_3_ = CONCAT12(this->_previousColor + 0x30,0x333b);
  local_38.super_Debug._flags._value = 'm';
  local_38.super_Debug._immediateFlags._value = '\0';
  local_38.super_Debug._output._4_1_ = uVar4;
LAB_001475a9:
  std::operator<<(this->_output,(char *)pEVar5);
  CVar2 = this->_previousColor;
  lVar3 = __tls_get_addr(&PTR_00179f98);
  *(Color *)(lVar3 + 0x18) = CVar2;
  bVar1 = (this->_internalFlags)._value;
  *(byte *)(lVar3 + 0x19) = bVar1 >> 3 & 1;
  *(byte *)(lVar3 + 0x1a) = bVar1 >> 4 & 1;
  return;
}

Assistant:

inline void Debug::resetColorInternal() {
    if(!_output || !(_internalFlags & InternalFlag::ColorWritten))
        return;

    _internalFlags &= ~InternalFlag::ColorWritten;
    _internalFlags |= InternalFlag::ValueWritten;
    #if defined(CORRADE_TARGET_WINDOWS) && !defined(CORRADE_UTILITY_USE_ANSI_COLORS)
    HANDLE h = streamOutputHandle(_output);
    if(h != INVALID_HANDLE_VALUE)
        SetConsoleTextAttribute(h, _previousColorAttributes);
    #else
    if(_internalFlags >= InternalFlag::PreviousColorBold || _internalFlags >= InternalFlag::PreviousColorInverted) {
        /* Only one of the two should be set by our code */
        CORRADE_INTERNAL_ASSERT(!(_internalFlags >= InternalFlag::PreviousColorBold) || !(_internalFlags >= InternalFlag::PreviousColorInverted));
        const char code[]{'\033', '[', '0', ';', _internalFlags >= InternalFlag::PreviousColorBold ? '1' : '7', ';', '3', char('0' + char(_previousColor)), 'm', '\0'};
        *_output << code;
    } else if(_previousColor != Color::Default) {
        const char code[]{'\033', '[', '0', ';', '3', char('0' + char(_previousColor)), 'm', '\0'};
        *_output << code;
    } else *_output << "\033[0m";

    debugGlobals.color = _previousColor;
    debugGlobals.colorBold = _internalFlags >= InternalFlag::PreviousColorBold;
    debugGlobals.colorInverted = _internalFlags >= InternalFlag::PreviousColorInverted;
    #endif
}